

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

void sexp_define_type_predicate(sexp_conflict ctx,sexp_conflict env,char *cname,sexp_uint_t type)

{
  sexp_conflict op;
  sexp_conflict name;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_68;
  sexp_conflict local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_48.var = &local_60;
  local_60 = (sexp_conflict)0x43e;
  local_58.next = &local_48;
  local_58.var = &local_68;
  local_68 = (sexp_conflict)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_58.next;
  (ctx->value).context.saves = &local_58;
  local_60 = (sexp_conflict)sexp_c_string(ctx,cname,0xffffffffffffffff);
  local_68 = (sexp_conflict)sexp_make_type_predicate_op(ctx,0,2,local_60,type * 2 + 1);
  local_60 = (sexp_conflict)sexp_intern(ctx,cname,0xffffffffffffffff);
  sexp_env_define(ctx,env,local_60,local_68);
  (ctx->value).context.saves = local_48.next;
  return;
}

Assistant:

static void sexp_define_type_predicate (sexp ctx, sexp env, const char *cname, sexp_uint_t type) {
  sexp_gc_var2(name, op);
  sexp_gc_preserve2(ctx, name, op);
  name = sexp_c_string(ctx, cname, -1);
  op = sexp_make_type_predicate(ctx, name, sexp_make_fixnum(type));
  sexp_env_define(ctx, env, name=sexp_intern(ctx, cname, -1), op);
  sexp_gc_release2(ctx);
}